

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void helper_lwm_mips(CPUMIPSState *env,target_ulong_conflict addr,target_ulong_conflict reglist,
                    uint32_t mem_idx)

{
  uint32_t uVar1;
  ulong uVar2;
  uintptr_t unaff_retaddr;
  
  if ((reglist & 0xf) - 1 < 9) {
    for (uVar2 = 0; (reglist & 0xf) << 2 != uVar2; uVar2 = uVar2 + 4) {
      uVar1 = cpu_ldl_mmuidx_ra_mips
                        ((CPUArchState_conflict5 *)env,addr + (int)uVar2,mem_idx,unaff_retaddr);
      (env->active_tc).gpr[*(int *)((long)multiple_regs + uVar2)] = uVar1;
    }
    addr = addr + (int)uVar2;
  }
  if ((reglist & 0x10) != 0) {
    uVar1 = cpu_ldl_mmuidx_ra_mips((CPUArchState_conflict5 *)env,addr,mem_idx,unaff_retaddr);
    (env->active_tc).gpr[0x1f] = uVar1;
  }
  return;
}

Assistant:

void helper_lwm(CPUMIPSState *env, target_ulong addr, target_ulong reglist,
                uint32_t mem_idx)
{
    target_ulong base_reglist = reglist & 0xf;
    target_ulong do_r31 = reglist & 0x10;

    if (base_reglist > 0 && base_reglist <= ARRAY_SIZE(multiple_regs)) {
        target_ulong i;

        for (i = 0; i < base_reglist; i++) {
            env->active_tc.gpr[multiple_regs[i]] =
                (target_long)cpu_ldl_mmuidx_ra(env, addr, mem_idx, GETPC());
            addr += 4;
        }
    }

    if (do_r31) {
        env->active_tc.gpr[31] =
            (target_long)cpu_ldl_mmuidx_ra(env, addr, mem_idx, GETPC());
    }
}